

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O3

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BuildValue *rhs)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  anon_union_80_2_ecfed234_for_valueData *paVar4;
  anon_union_80_2_ecfed234_for_valueData *paVar5;
  
  this->kind = Invalid;
  this->numOutputInfos = rhs->numOutputInfos;
  (this->signature).value = 0;
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  *(undefined8 *)((long)&this->valueData + 0x30) = 0;
  *(undefined8 *)((long)&this->valueData + 0x38) = 0;
  *(undefined8 *)((long)&this->valueData + 0x40) = 0;
  *(undefined8 *)((long)&this->valueData + 0x48) = 0;
  (this->stringValues).contents = (char *)0x0;
  (this->stringValues).size = 0;
  this->kind = rhs->kind;
  uVar1 = rhs->numOutputInfos;
  this->numOutputInfos = uVar1;
  (this->signature).value = (rhs->signature).value;
  paVar4 = &rhs->valueData;
  if (uVar1 < 2) {
    paVar5 = &this->valueData;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (paVar5->asOutputInfo).device = (paVar4->asOutputInfo).device;
      paVar4 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar4 + 8);
      paVar5 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar5 + 8);
    }
  }
  else {
    (this->valueData).asOutputInfo.device = (paVar4->asOutputInfo).device;
    (paVar4->asOutputInfo).device = 0;
  }
  if (((rhs->kind < SuccessfulCommandWithOutputSignature) &&
      ((0x10090U >> (rhs->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) && (this != rhs)) {
    (this->stringValues).size = (rhs->stringValues).size;
    pcVar2 = (this->stringValues).contents;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    (this->stringValues).contents = (rhs->stringValues).contents;
    (rhs->stringValues).contents = (char *)0x0;
  }
  return;
}

Assistant:

BuildValue(BuildValue&& rhs) : numOutputInfos(rhs.numOutputInfos) {
    kind = rhs.kind;
    numOutputInfos = rhs.numOutputInfos;
    signature = rhs.signature;
    if (rhs.hasMultipleOutputs()) {
      valueData.asOutputInfos = rhs.valueData.asOutputInfos;
      rhs.valueData.asOutputInfos = nullptr;
    } else {
      valueData.asOutputInfo = rhs.valueData.asOutputInfo;
    }
    if (rhs.kindHasStringList()) {
      stringValues = std::move(rhs.stringValues);
    }
  }